

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O2

string * __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::GenerateGetter
          (string *__return_storage_ptr__,NimBfbsGenerator *this,Type *type,string *offsetval,
          bool element_type)

{
  NimBfbsGenerator *this_00;
  BaseType BVar1;
  Enum *pEVar2;
  BaseType base_type;
  BaseType base_type_00;
  string *this_01;
  undefined1 enum_inner;
  undefined7 in_register_00000081;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_158;
  NimBfbsGenerator *local_138;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar3 = CONCAT71(in_register_00000081,element_type);
  this_01 = &bStack_158;
  local_138 = this;
  if ((int)uVar3 == 0) {
    BVar1 = reflection::Type::base_type(type);
    enum_inner = (undefined1)uVar3;
  }
  else {
    BVar1 = reflection::Type::element(type);
    enum_inner = (undefined1)uVar3;
  }
  std::__cxx11::string::string((string *)&offset,(string *)offsetval);
  if (!element_type) {
    std::operator+(&bStack_158,"self.tab.Pos + ",&offset);
    std::__cxx11::string::operator=((string *)&offset,(string *)&bStack_158);
    std::__cxx11::string::~string((string *)&bStack_158);
  }
  this_00 = local_138;
  switch(BVar1) {
  case String:
    std::operator+(&bStack_158,"self.tab.String(",&offset);
    std::operator+(__return_storage_ptr__,&bStack_158,")");
    break;
  case Vector:
    GenerateGetter(__return_storage_ptr__,local_138,type,offsetval,true);
    goto LAB_00242060;
  case Obj:
    (anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
              (&local_130,local_138,type,element_type,(bool)enum_inner);
    std::operator+(&local_110,&local_130,"(tab: Vtable(Bytes: self.tab.Bytes, Pos: ");
    std::operator+(&bStack_158,&local_110,&offset);
    std::operator+(__return_storage_ptr__,&bStack_158,"))");
    std::__cxx11::string::~string((string *)&bStack_158);
    std::__cxx11::string::~string((string *)&local_110);
    this_01 = &local_130;
    break;
  case Union:
    std::operator+(&bStack_158,"self.tab.Union(",offsetval);
    std::operator+(__return_storage_ptr__,&bStack_158,")");
    this_01 = &bStack_158;
    break;
  default:
    pEVar2 = BaseBfbsGenerator::GetEnum(&local_138->super_BaseBfbsGenerator,type,element_type);
    if (pEVar2 == (Enum *)0x0) {
      (anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
                (&local_d0,(void *)(ulong)BVar1,base_type);
      std::operator+(&local_130,"Get[",&local_d0);
      std::operator+(&local_110,&local_130,"](self.tab, ");
      std::operator+(&bStack_158,&local_110,&offset);
      std::operator+(__return_storage_ptr__,&bStack_158,")");
      std::__cxx11::string::~string((string *)&bStack_158);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      this_01 = &local_d0;
    }
    else {
      (anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
                (&local_90,this_00,type,element_type,(bool)enum_inner);
      std::operator+(&local_70,&local_90,"(");
      std::operator+(&local_50,&local_70,"Get[");
      (anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
                (&local_b0,(void *)(ulong)BVar1,base_type_00);
      std::operator+(&local_d0,&local_50,&local_b0);
      std::operator+(&local_130,&local_d0,"](self.tab, ");
      std::operator+(&local_110,&local_130,&offset);
      std::operator+(&bStack_158,&local_110,")");
      std::operator+(__return_storage_ptr__,&bStack_158,")");
      std::__cxx11::string::~string((string *)&bStack_158);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      this_01 = &local_90;
    }
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_00242060:
  std::__cxx11::string::~string((string *)&offset);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateGetter(const r::Type *type, const std::string &offsetval,
                             bool element_type = false) const {
    const r::BaseType base_type =
        element_type ? type->element() : type->base_type();
    std::string offset = offsetval;
    if (!element_type) { offset = "self.tab.Pos + " + offset; }
    switch (base_type) {
      case r::String: return "self.tab.String(" + offset + ")";
      case r::Union: return "self.tab.Union(" + offsetval + ")";
      case r::Obj: {
        return GenerateType(type, element_type) +
               "(tab: Vtable(Bytes: self.tab.Bytes, Pos: " + offset + "))";
      }
      case r::Vector: return GenerateGetter(type, offsetval, true);
      default:
        const r::Enum *type_enum = GetEnum(type, element_type);
        if (type_enum != nullptr) {
          return GenerateType(type, element_type) + "(" + "Get[" +
                 GenerateType(base_type) + "](self.tab, " + offset + ")" + ")";
        } else {
          return "Get[" + GenerateType(base_type) + "](self.tab, " + offset +
                 ")";
        }
    }
  }